

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Gia_ParFfSetDefault(Bmc_ParFf_t *p)

{
  p->fFfOnly = 0;
  p->fDump = 0;
  p->fDumpDelay = 0;
  p->fDumpUntest = 0;
  p->nIterCheck = 0;
  p->nCardConstr = 0;
  p->fNonStrict = 0;
  p->fBasic = 0;
  p->Algo = 0;
  p->fComplVars = 0;
  p->fStartPats = 0;
  p->nTimeOut = 0;
  p->pFileName = (char *)0x0;
  p->pFormStr = (char *)0x0;
  p->fDumpNewFaults = 0;
  p->fVerbose = 0;
  return;
}

Assistant:

void Gia_ParFfSetDefault( Bmc_ParFf_t * p )
{
    memset( p, 0, sizeof(Bmc_ParFf_t) );
    p->pFileName     =  NULL; 
    p->Algo          =     0; 
    p->fStartPats    =     0; 
    p->nTimeOut      =     0; 
    p->nIterCheck    =     0;
    p->fBasic        =     0; 
    p->fFfOnly       =     0;
    p->fDump         =     0; 
    p->fDumpUntest   =     0; 
    p->fVerbose      =     0; 
}